

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O0

Vec3 __thiscall rr::advblend::setLumSat(advblend *this,Vec3 *cbase,Vec3 *csat,Vec3 *clum)

{
  float s;
  Vec3 VVar1;
  Vector<float,_3> local_64;
  Vector<float,_3> local_58;
  tcu local_4c [8];
  float local_44;
  undefined1 local_40 [8];
  Vec3 color;
  float ssat;
  float sbase;
  float minbase;
  Vec3 *clum_local;
  Vec3 *csat_local;
  Vec3 *cbase_local;
  
  s = minComp(cbase);
  color.m_data[2] = saturation(cbase);
  color.m_data[1] = saturation(csat);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_40,0.0);
  if (0.0 < color.m_data[2]) {
    tcu::operator-((tcu *)&local_64,cbase,s);
    tcu::operator*((tcu *)&local_58,&local_64,color.m_data[1]);
    tcu::operator/(local_4c,&local_58,color.m_data[2]);
    local_40[0] = local_4c[0];
    local_40[1] = local_4c[1];
    local_40[2] = local_4c[2];
    local_40[3] = local_4c[3];
    local_40[4] = local_4c[4];
    local_40[5] = local_4c[5];
    local_40[6] = local_4c[6];
    local_40[7] = local_4c[7];
    color.m_data[0] = local_44;
  }
  VVar1 = setLum(this,(Vec3 *)local_40,clum);
  return (Vec3)VVar1.m_data;
}

Assistant:

Vec3 setLumSat (const Vec3& cbase, const Vec3& csat, const Vec3& clum)
{
	const float		minbase	= minComp(cbase);
	const float		sbase	= saturation(cbase);
	const float		ssat	= saturation(csat);
	Vec3			color	= Vec3(0.0f);

	if (sbase > 0.0f)
		color = (cbase - minbase) * ssat / sbase;
	else
		color = color;

	return setLum(color, clum);
}